

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::~array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this)

{
  Matrix<double,__1,_1,_0,__1,_1> *local_20;
  iterator i_1;
  int i;
  uint size;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  i_1._4_4_ = 1;
  for (i_1._0_4_ = 0; (int)i_1 < 2; i_1._0_4_ = (int)i_1 + 1) {
    i_1._4_4_ = this->_dims[(int)i_1] * i_1._4_4_;
  }
  if (((this->_array != (Matrix<double,__1,_1,_0,__1,_1> *)0x0) && (this->first != this->last)) &&
     (i_1._4_4_ != 0)) {
    for (local_20 = this->first; local_20 < this->last; local_20 = local_20 + 1) {
      __gnu_cxx::new_allocator<Eigen::Matrix<double,-1,1,0,-1,1>>::
      destroy<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((new_allocator<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,local_20);
    }
    __gnu_cxx::new_allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::deallocate
              ((new_allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,this->first,
               (long)this->last - (long)this->first >> 4);
  }
  this->_array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }